

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase124::run(TestCase124 *this)

{
  ArrayPtr<int> AVar1;
  ArrayPtr<int> AVar2;
  DebugComparison<int_*,_int_*> _kjCondition;
  int *local_40;
  int *local_38;
  Arena arena;
  
  Arena::Arena(&arena,0x400);
  AVar1 = Arena::allocateArray<int>(&arena,0x10);
  AVar2 = Arena::allocateArray<int>(&arena,8);
  _kjCondition.right = AVar2.ptr;
  _kjCondition.left = AVar1.ptr + AVar1.size_;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == _kjCondition.right;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_40 = _kjCondition.right;
    local_38 = _kjCondition.left;
    kj::_::Debug::log<char_const(&)[48],kj::_::DebugComparison<int*,int*>&,int*,int*>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena-test.c++"
               ,0x82,ERROR,
               "\"failed: expected \" \"(arr1.end()) == (arr2.begin())\", _kjCondition, arr1.end(), arr2.begin()"
               ,(char (*) [48])"failed: expected (arr1.end()) == (arr2.begin())",&_kjCondition,
               &local_38,&local_40);
  }
  Arena::~Arena(&arena);
  return;
}

Assistant:

TEST(Arena, TrivialArray) {
  Arena arena;
  ArrayPtr<int> arr1 = arena.allocateArray<int>(16);
  ArrayPtr<int> arr2 = arena.allocateArray<int>(8);

  // Trivial arrays should be tightly-packed.
  EXPECT_EQ(arr1.end(), arr2.begin());
}